

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor_rational.hpp
# Opt level: O2

void __thiscall soplex::SLUFactorRational::freeAll(SLUFactorRational *this)

{
  Perm *pPVar1;
  
  pPVar1 = &(this->super_CLUFactorRational).row;
  if ((this->super_CLUFactorRational).row.perm != (int *)0x0) {
    spx_free<int*>(&(this->super_CLUFactorRational).row.perm);
  }
  if (pPVar1->orig != (int *)0x0) {
    spx_free<int*>(&pPVar1->orig);
  }
  pPVar1 = &(this->super_CLUFactorRational).col;
  if ((this->super_CLUFactorRational).col.perm != (int *)0x0) {
    spx_free<int*>(&(this->super_CLUFactorRational).col.perm);
  }
  if (pPVar1->orig != (int *)0x0) {
    spx_free<int*>(&pPVar1->orig);
  }
  if ((this->super_CLUFactorRational).u.row.elem != (Dring *)0x0) {
    spx_free<soplex::CLUFactorRational::Dring*>(&(this->super_CLUFactorRational).u.row.elem);
  }
  if ((this->super_CLUFactorRational).u.row.idx != (int *)0x0) {
    spx_free<int*>(&(this->super_CLUFactorRational).u.row.idx);
  }
  if ((this->super_CLUFactorRational).u.row.start != (int *)0x0) {
    spx_free<int*>(&(this->super_CLUFactorRational).u.row.start);
  }
  if ((this->super_CLUFactorRational).u.row.len != (int *)0x0) {
    spx_free<int*>(&(this->super_CLUFactorRational).u.row.len);
  }
  if ((this->super_CLUFactorRational).u.row.max != (int *)0x0) {
    spx_free<int*>(&(this->super_CLUFactorRational).u.row.max);
  }
  if ((this->super_CLUFactorRational).u.col.elem != (Dring *)0x0) {
    spx_free<soplex::CLUFactorRational::Dring*>(&(this->super_CLUFactorRational).u.col.elem);
  }
  if ((this->super_CLUFactorRational).u.col.idx != (int *)0x0) {
    spx_free<int*>(&(this->super_CLUFactorRational).u.col.idx);
  }
  if ((this->super_CLUFactorRational).u.col.start != (int *)0x0) {
    spx_free<int*>(&(this->super_CLUFactorRational).u.col.start);
  }
  if ((this->super_CLUFactorRational).u.col.len != (int *)0x0) {
    spx_free<int*>(&(this->super_CLUFactorRational).u.col.len);
  }
  if ((this->super_CLUFactorRational).u.col.max != (int *)0x0) {
    spx_free<int*>(&(this->super_CLUFactorRational).u.col.max);
  }
  if ((this->super_CLUFactorRational).l.idx != (int *)0x0) {
    spx_free<int*>(&(this->super_CLUFactorRational).l.idx);
  }
  if ((this->super_CLUFactorRational).l.start != (int *)0x0) {
    spx_free<int*>(&(this->super_CLUFactorRational).l.start);
  }
  if ((this->super_CLUFactorRational).l.row != (int *)0x0) {
    spx_free<int*>(&(this->super_CLUFactorRational).l.row);
  }
  if ((this->super_CLUFactorRational).l.ridx != (int *)0x0) {
    spx_free<int*>(&(this->super_CLUFactorRational).l.ridx);
  }
  if ((this->super_CLUFactorRational).l.rbeg != (int *)0x0) {
    spx_free<int*>(&(this->super_CLUFactorRational).l.rbeg);
  }
  if ((this->super_CLUFactorRational).l.rorig != (int *)0x0) {
    spx_free<int*>(&(this->super_CLUFactorRational).l.rorig);
  }
  if ((this->super_CLUFactorRational).l.rperm != (int *)0x0) {
    spx_free<int*>(&(this->super_CLUFactorRational).l.rperm);
  }
  spx_free<soplex::Timer*>(&this->solveTime);
  spx_free<soplex::Timer*>(&(this->super_CLUFactorRational).factorTime);
  return;
}

Assistant:

inline void SLUFactorRational::freeAll()
{

   if(row.perm)
      spx_free(row.perm);

   if(row.orig)
      spx_free(row.orig);

   if(col.perm)
      spx_free(col.perm);

   if(col.orig)
      spx_free(col.orig);

   if(u.row.elem)
      spx_free(u.row.elem);

   if(u.row.idx)
      spx_free(u.row.idx);

   if(u.row.start)
      spx_free(u.row.start);

   if(u.row.len)
      spx_free(u.row.len);

   if(u.row.max)
      spx_free(u.row.max);

   if(u.col.elem)
      spx_free(u.col.elem);

   if(u.col.idx)
      spx_free(u.col.idx);

   if(u.col.start)
      spx_free(u.col.start);

   if(u.col.len)
      spx_free(u.col.len);

   if(u.col.max)
      spx_free(u.col.max);

   if(l.idx)
      spx_free(l.idx);

   if(l.start)
      spx_free(l.start);

   if(l.row)
      spx_free(l.row);

   if(l.ridx)
      spx_free(l.ridx);

   if(l.rbeg)
      spx_free(l.rbeg);

   if(l.rorig)
      spx_free(l.rorig);

   if(l.rperm)
      spx_free(l.rperm);

   spx_free(solveTime);
   spx_free(factorTime);
}